

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O2

bool __thiscall
cmm::CMMParser::parseStatement
          (CMMParser *this,
          unique_ptr<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_> *Res)

{
  bool bVar1;
  allocator local_29;
  string local_28;
  
  switch((this->Lexer).CurTok.Kind) {
  case Identifier:
  case String:
  case Integer:
  case Double:
  case Boolean:
  case LParen:
  case Plus:
  case Minus:
  case Exclaim:
  case Tilde:
    bVar1 = parseExprStatement(this,Res);
    return bVar1;
  default:
    std::__cxx11::string::string((string *)&local_28,"unexpected token in statement",&local_29);
    bVar1 = CMMLexer::Error(&this->Lexer,&local_28);
    break;
  case LCurly:
    bVar1 = parseBlock(this,Res);
    return bVar1;
  case Semicolon:
    parseEmptyStatement(this,Res);
    return false;
  case Kw_if:
    bVar1 = parseIfStatement(this,Res);
    return bVar1;
  case Kw_for:
    bVar1 = parseForStatement(this,Res);
    return bVar1;
  case Kw_while:
    bVar1 = parseWhileStatement(this,Res);
    return bVar1;
  case Kw_break:
    bVar1 = parseBreakStatement(this,Res);
    return bVar1;
  case Kw_continue:
    bVar1 = parseContinueStatement(this,Res);
    return bVar1;
  case Kw_return:
    bVar1 = parseReturnStatement(this,Res);
    return bVar1;
  case Kw_string:
  case Kw_int:
  case Kw_double:
  case Kw_bool:
    bVar1 = parseDeclarationStatement(this,Res);
    return bVar1;
  case Kw_void:
    std::__cxx11::string::string
              ((string *)&local_28,"`void\' only appears before function definition",&local_29);
    bVar1 = CMMLexer::Error(&this->Lexer,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool CMMParser::parseStatement(std::unique_ptr<StatementAST> &Res) {
  switch (getKind()) {
  default:
    return Error("unexpected token in statement");
  case Token::LCurly:       return parseBlock(Res);
  case Token::Kw_if:        return parseIfStatement(Res);
  case Token::Kw_while:     return parseWhileStatement(Res);
  case Token::Kw_for:       return parseForStatement(Res);
  case Token::Kw_return:    return parseReturnStatement(Res);
  case Token::Kw_break:     return parseBreakStatement(Res);
  case Token::Kw_continue:  return parseContinueStatement(Res);
  case Token::Semicolon:    return parseEmptyStatement(Res);
  case Token::Kw_bool:
  case Token::Kw_int:
  case Token::Kw_double:
  case Token::Kw_string:
    return parseDeclarationStatement(Res);
  case Token::Kw_void:
    return Error("`void' only appears before function definition");
  case Token::LParen:   case Token::Identifier:
  case Token::Double:   case Token::String:
  case Token::Boolean:  case Token::Integer:
  case Token::Plus:     case Token::Minus:
  case Token::Tilde:    case Token::Exclaim:
    return parseExprStatement(Res);
  }
}